

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn.cpp
# Opt level: O0

vec8 * asn1::mkINT(vec8 *__return_storage_ptr__,uint64_t val)

{
  size_type sVar1;
  reference pvVar2;
  int local_3c;
  value_type_conflict1 local_35;
  int i;
  value_type_conflict1 avStack_21 [8];
  uint8_t temp [8];
  uint64_t val_local;
  vec8 *out;
  
  temp[0] = '\0';
  unique0x10000100 = val;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  pushHead(__return_storage_ptr__,'\x02',0);
  if (stack0xffffffffffffffe8 == 0) {
    local_35 = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_35);
  }
  else {
    local_3c = 8;
    for (; stack0xffffffffffffffe8 != 0; register0x00000000 = stack0xffffffffffffffe8 >> 8) {
      local_3c = local_3c + -1;
      avStack_21[local_3c] = (value_type_conflict1)stack0xffffffffffffffe8;
    }
    for (; local_3c < 8; local_3c = local_3c + 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,avStack_21 + local_3c);
    }
  }
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(__return_storage_ptr__);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (__return_storage_ptr__,1);
  *pvVar2 = (char)sVar1 + 0xfe;
  return __return_storage_ptr__;
}

Assistant:

vec8 mkINT(uint64_t val)
{
    vec8 out;
    uint8_t temp[8];
    pushHead(out, 0x2, 0);
    if (val == 0) {
        out.push_back(0);
    } else {
        int i = 8;
        while (val) {
            temp[--i] = (val & 0xff);
            val >>= 8;
        }
        for (; i < 8; i++)
            out.push_back(temp[i]);
    }

    out[1] = (uint8_t)out.size() - 2;

    return out;
}